

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

double atan2d(double y,double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM1_Qa == 0.0) && (!NAN(in_XMM1_Qa))) {
      if (0.0 < in_XMM0_Qa) {
        return 90.0;
      }
      if (in_XMM0_Qa < 0.0) {
        return -90.0;
      }
    }
  }
  else {
    if (0.0 <= in_XMM1_Qa) {
      return 0.0;
    }
    if (in_XMM1_Qa < 0.0) {
      return 180.0;
    }
  }
  dVar1 = atan2(in_XMM0_Qa,in_XMM1_Qa);
  return dVar1 * 57.29577951308232;
}

Assistant:

double atan2d(double y, double x) {
    if (y == 0.0) {
        if (x >= 0.0) {
            return 0.0;
        } else if (x < 0.0) {
            return 180.0;
        }
    } else if (x == 0.0) {
        if (y > 0.0) {
            return 90.0;
        } else if (y < 0.0) {
            return -90.0;
        }
    }

    return atan2(y, x) * R2D;
}